

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O3

uint8_t __thiscall m6502::BCC(m6502 *this)

{
  uint8_t uVar1;
  uint uVar2;
  ushort uVar3;
  
  if ((this->status & 1) == 0) {
    uVar1 = this->cycles;
    this->cycles = uVar1 + '\x01';
    uVar2._0_2_ = this->pc;
    uVar2._2_1_ = this->status;
    uVar2._3_1_ = this->field_0x7;
    uVar3 = this->addrRel + (undefined2)uVar2;
    this->addrAbs = uVar3;
    if (0xff < ((uVar2 ^ uVar3) & 0xffff)) {
      this->cycles = uVar1 + '\x02';
    }
    this->pc = uVar3;
  }
  return '\0';
}

Assistant:

uint8_t BCC()
  {
    if (GetFlag(C) == 0)
    {
      ++cycles;
      addrAbs = pc + addrRel;
      if ((addrAbs & 0xFF00u) != (pc & 0xFF00u))
      {
        ++cycles;
      }
      pc = addrAbs;
    }
    return 0;
  }